

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  short sVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<short> *pGVar8;
  TransformerLogLin *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  ImPlotContext *pIVar13;
  ImDrawIdx IVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar13 = GImPlot;
  pGVar8 = this->Getter;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  lVar15 = (long)(((pGVar8->Offset + prim + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride;
  sVar4 = *(short *)((long)pGVar8->Ys + lVar15);
  dVar18 = log10((double)(int)*(short *)((long)pGVar8->Xs + lVar15) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar13->CurrentPlot;
  dVar2 = (pIVar10->XAxis).Range.Min;
  iVar5 = pTVar9->YAxis;
  fVar21 = (float)((((double)(float)(dVar18 / pIVar13->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar5].Min.x);
  fVar22 = (float)(((double)(int)sVar4 - pIVar10->YAxis[iVar5].Range.Min) * pIVar13->My[iVar5] +
                  (double)pIVar13->PixelRange[iVar5].Min.y);
  fVar20 = (this->P1).x;
  fVar23 = (this->P1).y;
  fVar19 = fVar23;
  if (fVar22 <= fVar23) {
    fVar19 = fVar22;
  }
  bVar16 = false;
  if ((fVar19 < (cull_rect->Max).y) &&
     (fVar19 = (float)(-(uint)(fVar22 <= fVar23) & (uint)fVar23 |
                      ~-(uint)(fVar22 <= fVar23) & (uint)fVar22), pfVar1 = &(cull_rect->Min).y,
     bVar16 = false, *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
    fVar19 = fVar20;
    if (fVar21 <= fVar20) {
      fVar19 = fVar21;
    }
    if (fVar19 < (cull_rect->Max).x) {
      fVar19 = (float)(~-(uint)(fVar21 <= fVar20) & (uint)fVar21 |
                      -(uint)(fVar21 <= fVar20) & (uint)fVar20);
      bVar16 = (cull_rect->Min).x <= fVar19 && fVar19 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar19 = this->Weight;
    IVar6 = this->Col;
    IVar3 = *uv;
    fVar20 = fVar21 - fVar20;
    fVar23 = fVar22 - fVar23;
    fVar17 = fVar20 * fVar20 + fVar23 * fVar23;
    if (0.0 < fVar17) {
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      fVar20 = fVar20 * (1.0 / fVar17);
      fVar23 = fVar23 * (1.0 / fVar17);
    }
    fVar19 = fVar19 * 0.5;
    fVar20 = fVar20 * fVar19;
    fVar19 = fVar19 * fVar23;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = (this->P1).x + fVar19;
    (pIVar11->pos).y = (this->P1).y - fVar20;
    pIVar11->uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar19 + fVar21;
    pIVar11[1].pos.y = fVar22 - fVar20;
    pIVar11[1].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar21 - fVar19;
    pIVar11[2].pos.y = fVar20 + fVar22;
    pIVar11[2].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = (this->P1).x - fVar19;
    pIVar11[3].pos.y = fVar20 + (this->P1).y;
    pIVar11[3].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar14 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar14;
    pIVar12[1] = IVar14 + 1;
    pIVar12[2] = IVar14 + 2;
    pIVar12[3] = IVar14;
    pIVar12[4] = IVar14 + 2;
    pIVar12[5] = IVar14 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  IVar3.y = fVar22;
  IVar3.x = fVar21;
  this->P1 = IVar3;
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }